

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idhash.c
# Opt level: O0

void nni_id_map_sys_fini(void)

{
  int local_c;
  int i;
  
  nni_mtx_lock(&id_reg_mtx);
  for (local_c = 0; local_c < id_reg_num; local_c = local_c + 1) {
    if (id_reg_map[local_c] != (nni_id_map *)0x0) {
      nni_id_map_fini(id_reg_map[local_c]);
    }
  }
  nni_free(id_reg_map,(long)id_reg_len << 3);
  id_reg_map = (nni_id_map **)0x0;
  id_reg_len = 0;
  id_reg_num = 0;
  nni_mtx_unlock(&id_reg_mtx);
  return;
}

Assistant:

void
nni_id_map_sys_fini(void)
{
	nni_mtx_lock(&id_reg_mtx);
	for (int i = 0; i < id_reg_num; i++) {
		if (id_reg_map[i] != NULL) {
			nni_id_map_fini(id_reg_map[i]);
		}
	}
	nni_free(id_reg_map, sizeof(nni_id_map *) * id_reg_len);
	id_reg_map = NULL;
	id_reg_len = 0;
	id_reg_num = 0;
	nni_mtx_unlock(&id_reg_mtx);
}